

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::emit_array_copy
          (CompilerGLSL *this,char *expr,uint32_t lhs_id,uint32_t rhs_id,StorageClass param_4,
          StorageClass param_5)

{
  string sStack_58;
  string lhs;
  
  lhs._M_dataplus._M_p = (pointer)&lhs.field_2;
  lhs._M_string_length = 0;
  lhs.field_2._M_local_buf[0] = '\0';
  if (expr == (char *)0x0) {
    to_expression_abi_cxx11_(&sStack_58,this,lhs_id,true);
    ::std::__cxx11::string::operator=((string *)&lhs,(string *)&sStack_58);
    ::std::__cxx11::string::~string((string *)&sStack_58);
  }
  else {
    ::std::__cxx11::string::assign((char *)&lhs);
  }
  to_expression_abi_cxx11_(&sStack_58,this,rhs_id,true);
  statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            (this,&lhs,(char (*) [4])0x2c1cbd,&sStack_58,(char (*) [2])0x2cce52);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  ::std::__cxx11::string::~string((string *)&lhs);
  return true;
}

Assistant:

bool CompilerGLSL::emit_array_copy(const char *expr, uint32_t lhs_id, uint32_t rhs_id, StorageClass, StorageClass)
{
	string lhs;
	if (expr)
		lhs = expr;
	else
		lhs = to_expression(lhs_id);

	statement(lhs, " = ", to_expression(rhs_id), ";");
	return true;
}